

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_6_6_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float *data;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  ulong uVar54;
  int iVar55;
  long lVar56;
  ulong uVar57;
  float *pfVar58;
  int iVar59;
  int iVar60;
  uint uVar61;
  long lVar62;
  float *pfVar63;
  float *pfVar64;
  long lVar65;
  long lVar66;
  int c1_1;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  int c1;
  int iVar74;
  int iVar75;
  int iVar76;
  long lVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  ulong uVar81;
  byte bVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  undefined1 auVar119 [16];
  float fVar120;
  undefined1 auVar122 [12];
  undefined1 auVar121 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  int data_width;
  float local_188;
  
  auVar90._8_4_ = 0x80000000;
  auVar90._0_8_ = 0x8000000080000000;
  auVar90._12_4_ = 0x80000000;
  auVar91._8_4_ = 0x3effffff;
  auVar91._0_8_ = 0x3effffff3effffff;
  auVar91._12_4_ = 0x3effffff;
  auVar121 = ZEXT1664(auVar91);
  fVar98 = ipoint->scale;
  auVar125 = ZEXT464((uint)fVar98);
  auVar83 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)fVar98),auVar90,0xf8);
  auVar83 = ZEXT416((uint)(fVar98 + auVar83._0_4_));
  auVar83 = vroundss_avx(auVar83,auVar83,0xb);
  iVar78 = (int)auVar83._0_4_;
  fVar96 = -0.08 / (fVar98 * fVar98);
  auVar84 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)ipoint->x),auVar90,0xf8);
  auVar84 = ZEXT416((uint)(ipoint->x + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85._0_8_ = (double)auVar84._0_4_;
  auVar85._8_8_ = auVar84._8_8_;
  auVar89._0_8_ = (double)fVar98;
  auVar89._8_8_ = 0;
  auVar84 = vfmadd231sd_fma(auVar85,auVar89,ZEXT816(0x3fe0000000000000));
  auVar88._0_4_ = (float)auVar84._0_8_;
  auVar88._4_12_ = auVar84._4_12_;
  auVar84 = vpternlogd_avx512vl(auVar91,ZEXT416((uint)ipoint->y),auVar90,0xf8);
  auVar84 = ZEXT416((uint)(ipoint->y + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar86._0_8_ = (double)auVar84._0_4_;
  auVar86._8_8_ = auVar84._8_8_;
  auVar84 = vfmadd231sd_fma(auVar86,auVar89,ZEXT816(0x3fe0000000000000));
  auVar87._0_4_ = (float)auVar84._0_8_;
  auVar87._4_12_ = auVar84._4_12_;
  auVar84._0_4_ = (int)auVar83._0_4_;
  auVar84._4_4_ = (int)auVar83._4_4_;
  auVar84._8_4_ = (int)auVar83._8_4_;
  auVar84._12_4_ = (int)auVar83._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar84);
  fVar7 = auVar88._0_4_ - auVar83._0_4_;
  fVar8 = auVar87._0_4_ - auVar83._0_4_;
  auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar98),auVar88);
  auVar84 = vpternlogd_avx512vl(auVar91,auVar83,auVar90,0xf8);
  auVar83 = ZEXT416((uint)(auVar83._0_4_ + auVar84._0_4_));
  auVar83 = vroundss_avx(auVar83,auVar83,0xb);
  auVar84 = ZEXT416((uint)fVar98);
  if (iVar78 < (int)auVar83._0_4_) {
    auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar84,auVar87);
    auVar92._8_4_ = 0x3effffff;
    auVar92._0_8_ = 0x3effffff3effffff;
    auVar92._12_4_ = 0x3effffff;
    auVar93._8_4_ = 0x80000000;
    auVar93._0_8_ = 0x8000000080000000;
    auVar93._12_4_ = 0x80000000;
    auVar85 = vpternlogd_avx512vl(auVar93,auVar83,auVar92,0xea);
    auVar83 = ZEXT416((uint)(auVar83._0_4_ + auVar85._0_4_));
    auVar83 = vroundss_avx(auVar83,auVar83,0xb);
    if (iVar78 < (int)auVar83._0_4_) {
      auVar83 = vfmadd231ss_fma(auVar88,auVar84,ZEXT416(0x41300000));
      auVar94._8_4_ = 0x80000000;
      auVar94._0_8_ = 0x8000000080000000;
      auVar94._12_4_ = 0x80000000;
      auVar85 = vpternlogd_avx512vl(auVar94,auVar83,auVar92,0xea);
      auVar83 = ZEXT416((uint)(auVar83._0_4_ + auVar85._0_4_));
      auVar83 = vroundss_avx(auVar83,auVar83,0xb);
      if ((int)auVar83._0_4_ + iVar78 <= iimage->width) {
        auVar83 = vfmadd231ss_fma(auVar87,auVar84,ZEXT416(0x41300000));
        auVar19._8_4_ = 0x80000000;
        auVar19._0_8_ = 0x8000000080000000;
        auVar19._12_4_ = 0x80000000;
        auVar85 = vpternlogd_avx512vl(auVar92,auVar83,auVar19,0xf8);
        auVar83 = ZEXT416((uint)(auVar83._0_4_ + auVar85._0_4_));
        auVar83 = vroundss_avx(auVar83,auVar83,0xb);
        if ((int)auVar83._0_4_ + iVar78 <= iimage->height) {
          fVar7 = fVar7 + 0.5;
          fVar8 = fVar8 + 0.5;
          pfVar63 = iimage->data;
          iVar1 = iimage->data_width;
          iVar55 = iVar78 * 2;
          pfVar64 = haarResponseY + 0x7d;
          pfVar58 = haarResponseX + 0x7d;
          uVar33 = 0xfffffff4;
          do {
            auVar83._0_4_ = (float)(int)uVar33;
            auVar122 = in_ZMM8._4_12_;
            auVar83._4_12_ = auVar122;
            auVar83 = vfmadd213ss_fma(auVar83,auVar84,ZEXT416((uint)fVar8));
            iVar38 = (int)auVar83._0_4_;
            auVar108._0_4_ = (float)(int)(uVar33 | 1);
            auVar108._4_12_ = auVar122;
            auVar83 = vfmadd213ss_fma(auVar108,auVar84,ZEXT416((uint)fVar8));
            iVar37 = (int)auVar83._0_4_;
            auVar109._0_4_ = (float)(int)(uVar33 + 2);
            auVar109._4_12_ = auVar122;
            auVar85 = ZEXT416((uint)fVar8);
            auVar83 = vfmadd213ss_fma(auVar109,auVar84,auVar85);
            iVar36 = (int)auVar83._0_4_;
            auVar110._0_4_ = (float)(int)(uVar33 + 3);
            auVar110._4_12_ = auVar122;
            auVar83 = vfmadd213ss_fma(auVar110,auVar84,auVar85);
            iVar35 = (int)auVar83._0_4_;
            auVar111._0_4_ = (float)(int)(uVar33 + 4);
            auVar111._4_12_ = auVar122;
            auVar83 = vfmadd213ss_fma(auVar111,auVar84,auVar85);
            iVar26 = (int)auVar83._0_4_;
            auVar112._0_4_ = (float)(int)(uVar33 + 5);
            auVar112._4_12_ = auVar122;
            auVar83 = vfmadd213ss_fma(auVar112,auVar84,auVar85);
            iVar40 = (iVar38 + -1) * iVar1;
            iVar41 = (iVar38 + -1 + iVar78) * iVar1;
            iVar50 = (iVar38 + -1 + iVar55) * iVar1;
            iVar48 = (iVar37 + -1) * iVar1;
            iVar42 = (iVar37 + -1 + iVar78) * iVar1;
            iVar51 = (iVar37 + -1 + iVar55) * iVar1;
            iVar46 = (iVar36 + -1) * iVar1;
            iVar43 = (iVar36 + -1 + iVar78) * iVar1;
            iVar49 = (iVar36 + -1 + iVar55) * iVar1;
            iVar37 = (iVar35 + -1) * iVar1;
            iVar44 = (iVar35 + -1 + iVar78) * iVar1;
            iVar47 = (iVar35 + -1 + iVar55) * iVar1;
            iVar35 = (iVar26 + -1) * iVar1;
            iVar38 = (iVar26 + -1 + iVar78) * iVar1;
            iVar45 = (iVar26 + -1 + iVar55) * iVar1;
            iVar26 = (int)auVar83._0_4_;
            iVar36 = (iVar26 + -1) * iVar1;
            iVar39 = (iVar26 + -1 + iVar78) * iVar1;
            iVar26 = (iVar26 + -1 + iVar55) * iVar1;
            lVar72 = 0;
            do {
              iVar52 = (int)lVar72;
              auVar113._0_4_ = (float)(iVar52 + -0xc);
              auVar122 = auVar121._4_12_;
              auVar113._4_12_ = auVar122;
              auVar83 = vfmadd213ss_fma(auVar113,auVar84,ZEXT416((uint)fVar7));
              iVar29 = (int)auVar83._0_4_;
              auVar114._0_4_ = (float)(iVar52 + -0xb);
              auVar114._4_12_ = auVar122;
              auVar83 = vfmadd213ss_fma(auVar114,auVar84,ZEXT416((uint)fVar7));
              iVar80 = (int)auVar83._0_4_;
              auVar115._0_4_ = (float)(iVar52 + -10);
              auVar115._4_12_ = auVar122;
              auVar85 = ZEXT416((uint)fVar7);
              auVar83 = vfmadd213ss_fma(auVar115,auVar84,auVar85);
              iVar76 = (int)auVar83._0_4_;
              auVar116._0_4_ = (float)(iVar52 + -9);
              auVar116._4_12_ = auVar122;
              auVar83 = vfmadd213ss_fma(auVar116,auVar84,auVar85);
              iVar74 = (int)auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(float)(iVar52 + -8)),auVar84,auVar85);
              iVar53 = (int)auVar83._0_4_;
              iVar32 = iVar29 + -1 + iVar78;
              iVar60 = iVar29 + -1 + iVar55;
              fVar98 = pfVar63[iVar41 + -1 + iVar29];
              fVar97 = pfVar63[iVar50 + -1 + iVar29];
              fVar118 = pfVar63[iVar50 + iVar60];
              fVar9 = pfVar63[iVar40 + -1 + iVar29];
              fVar10 = pfVar63[iVar40 + iVar60];
              auVar86 = SUB6416(ZEXT464(0x40000000),0);
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar40 + iVar32] -
                                                      pfVar63[iVar50 + iVar32])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar41 + iVar60];
              pfVar58[lVar72 + -0x7d] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x7d] = auVar83._0_4_ - (fVar97 - fVar10);
              iVar70 = iVar80 + -1 + iVar78;
              iVar67 = iVar80 + -1 + iVar55;
              fVar98 = pfVar63[iVar41 + -1 + iVar80];
              fVar97 = pfVar63[iVar50 + -1 + iVar80];
              fVar118 = pfVar63[iVar50 + iVar67];
              fVar9 = pfVar63[iVar40 + -1 + iVar80];
              fVar10 = pfVar63[iVar40 + iVar67];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar40 + iVar70] -
                                                      pfVar63[iVar50 + iVar70])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar41 + iVar67];
              pfVar58[lVar72 + -0x7c] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              iVar59 = iVar76 + -1 + iVar78;
              iVar68 = iVar76 + -1 + iVar55;
              pfVar64[lVar72 + -0x7c] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar41 + -1 + iVar76];
              fVar97 = pfVar63[iVar50 + -1 + iVar76];
              fVar118 = pfVar63[iVar50 + iVar68];
              fVar9 = pfVar63[iVar40 + -1 + iVar76];
              fVar10 = pfVar63[iVar40 + iVar68];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar40 + iVar59] -
                                                      pfVar63[iVar50 + iVar59])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar41 + iVar68];
              pfVar58[lVar72 + -0x7b] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x7b] = auVar83._0_4_ - (fVar97 - fVar10);
              iVar30 = iVar74 + -1 + iVar78;
              iVar75 = iVar74 + -1 + iVar55;
              fVar98 = pfVar63[iVar41 + -1 + iVar74];
              fVar97 = pfVar63[iVar50 + -1 + iVar74];
              fVar118 = pfVar63[iVar50 + iVar75];
              fVar9 = pfVar63[iVar40 + -1 + iVar74];
              fVar10 = pfVar63[iVar40 + iVar75];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar40 + iVar30] -
                                                      pfVar63[iVar50 + iVar30])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar41 + iVar75];
              pfVar58[lVar72 + -0x7a] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              iVar69 = iVar53 + -1 + iVar78;
              pfVar64[lVar72 + -0x7a] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar41 + -1 + iVar53];
              fVar97 = pfVar63[iVar50 + -1 + iVar53];
              iVar27 = iVar53 + -1 + iVar55;
              fVar10 = pfVar63[iVar50 + iVar27] - pfVar63[iVar40 + -1 + iVar53];
              auVar121 = ZEXT464((uint)fVar10);
              fVar118 = pfVar63[iVar40 + iVar27];
              fVar9 = pfVar63[iVar41 + iVar27];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar40 + iVar69] -
                                                      pfVar63[iVar50 + iVar69])),auVar86,
                                        ZEXT416((uint)fVar10));
              pfVar58[lVar72 + -0x79] = (fVar97 - fVar118) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(float)(iVar52 + -7)),auVar84,auVar85);
              auVar85 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar9)),auVar86,
                                        ZEXT416((uint)fVar10));
              pfVar64[lVar72 + -0x79] = auVar85._0_4_ - (fVar97 - fVar118);
              iVar79 = (int)auVar83._0_4_;
              iVar31 = iVar79 + -1 + iVar78;
              fVar98 = pfVar63[iVar41 + -1 + iVar79];
              fVar97 = pfVar63[iVar50 + -1 + iVar79];
              iVar28 = iVar79 + -1 + iVar55;
              fVar118 = pfVar63[iVar50 + iVar28];
              fVar9 = pfVar63[iVar40 + -1 + iVar79];
              fVar10 = pfVar63[iVar40 + iVar28];
              fVar103 = pfVar63[iVar41 + iVar28];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar40 + iVar31] -
                                                      pfVar63[iVar50 + iVar31])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x78] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x78] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar42 + -1 + iVar29];
              fVar97 = pfVar63[iVar51 + -1 + iVar29];
              fVar118 = pfVar63[iVar51 + iVar60];
              fVar9 = pfVar63[iVar48 + -1 + iVar29];
              fVar10 = pfVar63[iVar48 + iVar60];
              fVar103 = pfVar63[iVar42 + iVar60];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar48 + iVar32] -
                                                      pfVar63[iVar51 + iVar32])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x65] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x65] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar42 + -1 + iVar80];
              fVar97 = pfVar63[iVar51 + -1 + iVar80];
              fVar118 = pfVar63[iVar51 + iVar67];
              fVar9 = pfVar63[iVar48 + -1 + iVar80];
              fVar10 = pfVar63[iVar48 + iVar67];
              fVar103 = pfVar63[iVar42 + iVar67];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar48 + iVar70] -
                                                      pfVar63[iVar51 + iVar70])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -100] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -100] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar42 + -1 + iVar76];
              fVar97 = pfVar63[iVar51 + -1 + iVar76];
              fVar118 = pfVar63[iVar51 + iVar68];
              fVar9 = pfVar63[iVar48 + -1 + iVar76];
              fVar10 = pfVar63[iVar48 + iVar68];
              fVar103 = pfVar63[iVar42 + iVar68];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar48 + iVar59] -
                                                      pfVar63[iVar51 + iVar59])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -99] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -99] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar42 + -1 + iVar74];
              fVar97 = pfVar63[iVar51 + -1 + iVar74];
              fVar118 = pfVar63[iVar51 + iVar75];
              fVar9 = pfVar63[iVar48 + -1 + iVar74];
              fVar10 = pfVar63[iVar48 + iVar75];
              fVar103 = pfVar63[iVar42 + iVar75];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar48 + iVar30] -
                                                      pfVar63[iVar51 + iVar30])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x62] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x62] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar42 + -1 + iVar53];
              fVar97 = pfVar63[iVar51 + -1 + iVar53];
              fVar118 = pfVar63[iVar51 + iVar27];
              fVar9 = pfVar63[iVar48 + -1 + iVar53];
              fVar10 = pfVar63[iVar48 + iVar27];
              fVar103 = pfVar63[iVar42 + iVar27];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar48 + iVar69] -
                                                      pfVar63[iVar51 + iVar69])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x61] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x61] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar42 + -1 + iVar79];
              fVar97 = pfVar63[iVar51 + -1 + iVar79];
              fVar118 = pfVar63[iVar51 + iVar28];
              fVar9 = pfVar63[iVar48 + -1 + iVar79];
              fVar10 = pfVar63[iVar48 + iVar28];
              fVar103 = pfVar63[iVar42 + iVar28];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar48 + iVar31] -
                                                      pfVar63[iVar51 + iVar31])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x60] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x60] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar43 + -1 + iVar29];
              fVar97 = pfVar63[iVar49 + -1 + iVar29];
              fVar118 = pfVar63[iVar49 + iVar60];
              fVar9 = pfVar63[iVar46 + -1 + iVar29];
              fVar10 = pfVar63[iVar46 + iVar60];
              fVar103 = pfVar63[iVar43 + iVar60];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar46 + iVar32] -
                                                      pfVar63[iVar49 + iVar32])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x4d] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x4d] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar43 + -1 + iVar80];
              fVar97 = pfVar63[iVar49 + -1 + iVar80];
              fVar118 = pfVar63[iVar49 + iVar67];
              fVar9 = pfVar63[iVar46 + -1 + iVar80];
              fVar10 = pfVar63[iVar46 + iVar67];
              fVar103 = pfVar63[iVar43 + iVar67];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar46 + iVar70] -
                                                      pfVar63[iVar49 + iVar70])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x4c] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x4c] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar43 + -1 + iVar76];
              fVar97 = pfVar63[iVar49 + -1 + iVar76];
              fVar118 = pfVar63[iVar49 + iVar68];
              fVar9 = pfVar63[iVar46 + -1 + iVar76];
              fVar10 = pfVar63[iVar46 + iVar68];
              fVar103 = pfVar63[iVar43 + iVar68];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar46 + iVar59] -
                                                      pfVar63[iVar49 + iVar59])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x4b] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x4b] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar43 + -1 + iVar74];
              fVar97 = pfVar63[iVar49 + -1 + iVar74];
              fVar118 = pfVar63[iVar49 + iVar75];
              fVar9 = pfVar63[iVar46 + -1 + iVar74];
              fVar10 = pfVar63[iVar46 + iVar75];
              fVar103 = pfVar63[iVar43 + iVar75];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar46 + iVar30] -
                                                      pfVar63[iVar49 + iVar30])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x4a] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x4a] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar43 + -1 + iVar53];
              fVar97 = pfVar63[iVar49 + -1 + iVar53];
              fVar118 = pfVar63[iVar49 + iVar27];
              fVar9 = pfVar63[iVar46 + -1 + iVar53];
              fVar10 = pfVar63[iVar46 + iVar27];
              fVar103 = pfVar63[iVar43 + iVar27];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar46 + iVar69] -
                                                      pfVar63[iVar49 + iVar69])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x49] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x49] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar43 + -1 + iVar79];
              fVar97 = pfVar63[iVar49 + -1 + iVar79];
              fVar118 = pfVar63[iVar49 + iVar28];
              fVar9 = pfVar63[iVar46 + -1 + iVar79];
              fVar10 = pfVar63[iVar46 + iVar28];
              fVar103 = pfVar63[iVar43 + iVar28];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar46 + iVar31] -
                                                      pfVar63[iVar49 + iVar31])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x48] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x48] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar44 + -1 + iVar29];
              fVar97 = pfVar63[iVar47 + -1 + iVar29];
              fVar118 = pfVar63[iVar47 + iVar60];
              fVar9 = pfVar63[iVar37 + -1 + iVar29];
              fVar10 = pfVar63[iVar37 + iVar60];
              fVar103 = pfVar63[iVar44 + iVar60];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar37 + iVar32] -
                                                      pfVar63[iVar47 + iVar32])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x35] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x35] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar44 + -1 + iVar80];
              fVar97 = pfVar63[iVar47 + -1 + iVar80];
              fVar118 = pfVar63[iVar47 + iVar67];
              fVar9 = pfVar63[iVar37 + -1 + iVar80];
              fVar10 = pfVar63[iVar37 + iVar67];
              fVar103 = pfVar63[iVar44 + iVar67];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar37 + iVar70] -
                                                      pfVar63[iVar47 + iVar70])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x34] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x34] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar44 + -1 + iVar76];
              fVar97 = pfVar63[iVar47 + -1 + iVar76];
              fVar118 = pfVar63[iVar47 + iVar68];
              fVar9 = pfVar63[iVar37 + -1 + iVar76];
              fVar10 = pfVar63[iVar37 + iVar68];
              fVar103 = pfVar63[iVar44 + iVar68];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar37 + iVar59] -
                                                      pfVar63[iVar47 + iVar59])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x33] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x33] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar44 + -1 + iVar74];
              fVar97 = pfVar63[iVar47 + -1 + iVar74];
              fVar118 = pfVar63[iVar47 + iVar75];
              fVar9 = pfVar63[iVar37 + -1 + iVar74];
              fVar10 = pfVar63[iVar37 + iVar75];
              fVar103 = pfVar63[iVar44 + iVar75];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar37 + iVar30] -
                                                      pfVar63[iVar47 + iVar30])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x32] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x32] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar44 + -1 + iVar53];
              fVar97 = pfVar63[iVar47 + -1 + iVar53];
              fVar118 = pfVar63[iVar47 + iVar27];
              fVar9 = pfVar63[iVar37 + -1 + iVar53];
              fVar10 = pfVar63[iVar37 + iVar27];
              fVar103 = pfVar63[iVar44 + iVar27];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar37 + iVar69] -
                                                      pfVar63[iVar47 + iVar69])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x31] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x31] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar44 + -1 + iVar79];
              fVar97 = pfVar63[iVar47 + -1 + iVar79];
              fVar118 = pfVar63[iVar47 + iVar28];
              fVar9 = pfVar63[iVar37 + -1 + iVar79];
              fVar10 = pfVar63[iVar37 + iVar28];
              fVar103 = pfVar63[iVar44 + iVar28];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar37 + iVar31] -
                                                      pfVar63[iVar47 + iVar31])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x30] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x30] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar38 + -1 + iVar29];
              fVar97 = pfVar63[iVar45 + -1 + iVar29];
              fVar118 = pfVar63[iVar45 + iVar60];
              fVar9 = pfVar63[iVar35 + -1 + iVar29];
              fVar10 = pfVar63[iVar35 + iVar60];
              fVar103 = pfVar63[iVar38 + iVar60];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar35 + iVar32] -
                                                      pfVar63[iVar45 + iVar32])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x1d] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x1d] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar38 + -1 + iVar80];
              fVar97 = pfVar63[iVar45 + -1 + iVar80];
              fVar118 = pfVar63[iVar45 + iVar67];
              fVar9 = pfVar63[iVar35 + -1 + iVar80];
              fVar10 = pfVar63[iVar35 + iVar67];
              fVar103 = pfVar63[iVar38 + iVar67];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar35 + iVar70] -
                                                      pfVar63[iVar45 + iVar70])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x1c] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x1c] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar38 + -1 + iVar76];
              fVar97 = pfVar63[iVar45 + -1 + iVar76];
              fVar118 = pfVar63[iVar45 + iVar68];
              fVar9 = pfVar63[iVar35 + -1 + iVar76];
              fVar10 = pfVar63[iVar35 + iVar68];
              fVar103 = pfVar63[iVar38 + iVar68];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar35 + iVar59] -
                                                      pfVar63[iVar45 + iVar59])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x1b] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x1b] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar38 + -1 + iVar74];
              fVar97 = pfVar63[iVar45 + -1 + iVar74];
              fVar118 = pfVar63[iVar45 + iVar75];
              fVar9 = pfVar63[iVar35 + -1 + iVar74];
              fVar10 = pfVar63[iVar35 + iVar75];
              fVar103 = pfVar63[iVar38 + iVar75];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar35 + iVar30] -
                                                      pfVar63[iVar45 + iVar30])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x1a] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x1a] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar38 + -1 + iVar53];
              fVar97 = pfVar63[iVar45 + -1 + iVar53];
              fVar118 = pfVar63[iVar45 + iVar27];
              fVar9 = pfVar63[iVar35 + -1 + iVar53];
              fVar10 = pfVar63[iVar35 + iVar27];
              fVar103 = pfVar63[iVar38 + iVar27];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar35 + iVar69] -
                                                      pfVar63[iVar45 + iVar69])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x19] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x19] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar38 + -1 + iVar79];
              fVar97 = pfVar63[iVar45 + -1 + iVar79];
              fVar118 = pfVar63[iVar45 + iVar28];
              fVar9 = pfVar63[iVar35 + -1 + iVar79];
              fVar10 = pfVar63[iVar35 + iVar28];
              fVar103 = pfVar63[iVar38 + iVar28];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar35 + iVar31] -
                                                      pfVar63[iVar45 + iVar31])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -0x18] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -0x18] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar39 + -1 + iVar29];
              fVar97 = pfVar63[iVar26 + -1 + iVar29];
              fVar118 = pfVar63[iVar60 + iVar26];
              fVar9 = pfVar63[iVar36 + -1 + iVar29];
              fVar10 = pfVar63[iVar36 + iVar60];
              fVar103 = pfVar63[iVar39 + iVar60];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar36 + iVar32] -
                                                      pfVar63[iVar32 + iVar26])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72 + -5] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -5] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar39 + -1 + iVar80];
              fVar97 = pfVar63[iVar26 + -1 + iVar80];
              fVar118 = pfVar63[iVar67 + iVar26];
              fVar9 = pfVar63[iVar36 + -1 + iVar80];
              fVar10 = pfVar63[iVar36 + iVar67];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar36 + iVar70] -
                                                      pfVar63[iVar70 + iVar26])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar39 + iVar67];
              pfVar58[lVar72 + -4] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -4] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar39 + -1 + iVar76];
              fVar97 = pfVar63[iVar26 + -1 + iVar76];
              fVar118 = pfVar63[iVar68 + iVar26];
              fVar9 = pfVar63[iVar36 + -1 + iVar76];
              fVar10 = pfVar63[iVar36 + iVar68];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar36 + iVar59] -
                                                      pfVar63[iVar59 + iVar26])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar39 + iVar68];
              pfVar58[lVar72 + -3] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -3] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar39 + -1 + iVar74];
              fVar97 = pfVar63[iVar26 + -1 + iVar74];
              fVar118 = pfVar63[iVar75 + iVar26];
              fVar9 = pfVar63[iVar36 + -1 + iVar74];
              fVar10 = pfVar63[iVar36 + iVar75];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar36 + iVar30] -
                                                      pfVar63[iVar30 + iVar26])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar39 + iVar75];
              pfVar58[lVar72 + -2] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -2] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar39 + -1 + iVar53];
              fVar97 = pfVar63[iVar26 + -1 + iVar53];
              fVar118 = pfVar63[iVar27 + iVar26];
              fVar9 = pfVar63[iVar36 + -1 + iVar53];
              fVar10 = pfVar63[iVar36 + iVar27];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar36 + iVar69] -
                                                      pfVar63[iVar69 + iVar26])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              fVar103 = pfVar63[iVar39 + iVar27];
              pfVar58[lVar72 + -1] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72 + -1] = auVar83._0_4_ - (fVar97 - fVar10);
              fVar98 = pfVar63[iVar39 + -1 + iVar79];
              fVar97 = pfVar63[iVar26 + -1 + iVar79];
              fVar118 = pfVar63[iVar28 + iVar26];
              fVar9 = pfVar63[iVar36 + -1 + iVar79];
              fVar10 = pfVar63[iVar36 + iVar28];
              fVar103 = pfVar63[iVar39 + iVar28];
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar63[iVar36 + iVar31] -
                                                      pfVar63[iVar31 + iVar26])),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar58[lVar72] = (fVar97 - fVar10) + auVar83._0_4_;
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar98 - fVar103)),auVar86,
                                        ZEXT416((uint)(fVar118 - fVar9)));
              pfVar64[lVar72] = auVar83._0_4_ - (fVar97 - fVar10);
              lVar72 = lVar72 + 6;
            } while (iVar52 + -0xc < 6);
            pfVar64 = pfVar64 + 0x90;
            pfVar58 = pfVar58 + 0x90;
            bVar2 = (int)uVar33 < 6;
            uVar33 = uVar33 + 6;
          } while (bVar2);
          goto LAB_002762e3;
        }
      }
    }
  }
  iVar1 = iVar78 * 2;
  lVar72 = 0;
  uVar33 = 0xfffffff4;
  do {
    auVar83 = vpbroadcastd_avx512vl();
    auVar83 = vpaddd_avx(auVar83,_DAT_005766e0);
    auVar101._0_4_ = (float)(int)uVar33;
    auVar101._4_12_ = in_ZMM8._4_12_;
    auVar85 = vfmadd213ss_fma(auVar101,auVar125._0_16_,ZEXT416((uint)fVar8));
    auVar104._0_4_ = (float)(int)(uVar33 | 1);
    auVar104._4_12_ = in_ZMM8._4_12_;
    auVar86 = vfmadd213ss_fma(auVar104,auVar125._0_16_,ZEXT416((uint)fVar8));
    fVar97 = auVar85._0_4_;
    auVar121 = ZEXT1664(ZEXT816(0x3fe0000000000000));
    iVar74 = (int)((double)((ulong)(0.0 <= fVar97) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar97) * -0x4020000000000000) + (double)fVar97);
    fVar97 = auVar86._0_4_;
    auVar83 = vcvtdq2ps_avx(auVar83);
    auVar25._4_4_ = fVar8;
    auVar25._0_4_ = fVar8;
    auVar25._8_4_ = fVar8;
    auVar25._12_4_ = fVar8;
    auVar22._4_4_ = fVar98;
    auVar22._0_4_ = fVar98;
    auVar22._8_4_ = fVar98;
    auVar22._12_4_ = fVar98;
    auVar83 = vfmadd132ps_fma(auVar83,auVar25,auVar22);
    uVar34 = vcmpps_avx512vl(auVar83,_DAT_00576190,0xd);
    auVar6 = vcvtps2pd_avx(auVar83);
    auVar106._8_8_ = 0xbfe0000000000000;
    auVar106._0_8_ = 0xbfe0000000000000;
    auVar106._16_8_ = 0xbfe0000000000000;
    auVar106._24_8_ = 0xbfe0000000000000;
    auVar95._12_4_ = 0x3fe00000;
    auVar95._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar95._16_8_ = 0x3fe0000000000000;
    auVar95._24_8_ = 0x3fe0000000000000;
    auVar95 = vblendmpd_avx512vl(auVar106,auVar95);
    bVar2 = (bool)((byte)uVar34 & 1);
    bVar3 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar34 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar99._0_4_ =
         (int)((double)((ulong)bVar2 * auVar95._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar99._4_4_ =
         (int)((double)((ulong)bVar3 * auVar95._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar99._8_4_ =
         (int)((double)((ulong)bVar4 * auVar95._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar99._12_4_ =
         (int)((double)((ulong)bVar5 * auVar95._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar26 = (int)((double)((ulong)(0.0 <= fVar97) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar97) * -0x4020000000000000) + (double)fVar97);
    iVar35 = iVar1 + iVar74;
    iVar36 = iVar74 + -1 + iVar78;
    iVar37 = iVar74 + -1;
    iVar38 = iVar1 + iVar26;
    iVar39 = iVar26 + -1 + iVar78;
    auVar20._8_4_ = 1;
    auVar20._0_8_ = 0x100000001;
    auVar20._12_4_ = 1;
    uVar34 = vpcmpd_avx512vl(auVar99,auVar20,1);
    uVar81 = uVar34 & 0xf;
    uVar57 = uVar81 >> 1;
    uVar54 = uVar81 >> 2;
    uVar81 = uVar81 >> 3;
    iVar40 = iVar26 + -1;
    iVar41 = iVar1 + auVar99._12_4_;
    iVar42 = auVar99._12_4_ + -1 + iVar78;
    iVar43 = auVar99._12_4_ + -1;
    iVar44 = iVar1 + auVar99._8_4_;
    iVar45 = auVar99._8_4_ + -1 + iVar78;
    iVar46 = auVar99._8_4_ + -1;
    iVar47 = iVar1 + auVar99._4_4_;
    iVar48 = auVar99._4_4_ + -1 + iVar78;
    iVar49 = auVar99._4_4_ + -1;
    iVar50 = iVar1 + auVar99._0_4_;
    iVar51 = auVar99._0_4_ + -1 + iVar78;
    iVar52 = auVar99._0_4_ + -1;
    lVar71 = lVar72;
    iVar55 = -0xc;
    do {
      auVar100._0_4_ = (float)iVar55;
      auVar119._4_12_ = auVar121._4_12_;
      auVar100._4_12_ = auVar119._4_12_;
      auVar83 = vfmadd213ss_fma(auVar100,auVar125._0_16_,ZEXT416((uint)fVar7));
      auVar119._0_4_ = (float)(iVar55 + 1);
      auVar85 = vfmadd213ss_fma(auVar119,auVar125._0_16_,ZEXT416((uint)fVar7));
      auVar121 = ZEXT1664(auVar85);
      fVar97 = auVar83._0_4_;
      fVar118 = auVar85._0_4_;
      pfVar63 = (float *)((long)haarResponseY + lVar71);
      iVar53 = (int)((double)((ulong)(0.0 <= fVar97) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar97) * -0x4020000000000000) + (double)fVar97);
      if ((((iVar74 < 1) || (iVar53 < 1)) || (iimage->height < iVar35)) ||
         (iVar27 = iVar1 + iVar53, iimage->width < iVar27)) {
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar53,iVar78,(float *)((long)haarResponseX + lVar71),pfVar63);
        auVar121 = ZEXT464((uint)fVar118);
      }
      else {
        iVar29 = iVar53 + -1 + iVar78;
        pfVar64 = iimage->data;
        iVar28 = iimage->data_width;
        iVar31 = iVar28 * iVar37;
        fVar97 = pfVar64[iVar28 * iVar36 + -1 + iVar53];
        iVar30 = iVar28 * (iVar1 + -1 + iVar74);
        fVar9 = pfVar64[iVar30 + -1 + iVar53];
        fVar10 = pfVar64[iVar30 + -1 + iVar27];
        fVar103 = pfVar64[iVar31 + -1 + iVar53];
        fVar11 = pfVar64[iVar31 + -1 + iVar27];
        fVar12 = pfVar64[iVar28 * iVar36 + -1 + iVar27];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar64[iVar31 + iVar29] - pfVar64[iVar30 + iVar29]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar103)));
        *(float *)((long)haarResponseX + lVar71) = (fVar9 - fVar11) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar103)));
        *pfVar63 = auVar83._0_4_ - (fVar9 - fVar11);
      }
      iVar27 = (int)((double)((ulong)(0.0 <= fVar118) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar118) * -0x4020000000000000) + (double)auVar121._0_4_)
      ;
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 4);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 4);
      if (((iVar74 < 1) || (iVar27 < 1)) ||
         ((iimage->height < iVar35 || (iVar28 = iVar1 + iVar27, iimage->width < iVar28)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar27,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar30 = iVar27 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar29 = iimage->data_width;
        iVar32 = iVar29 * iVar37;
        fVar97 = pfVar58[iVar29 * iVar36 + -1 + iVar27];
        iVar31 = iVar29 * (iVar1 + -1 + iVar74);
        fVar118 = pfVar58[iVar31 + -1 + iVar27];
        fVar9 = pfVar58[iVar31 + -1 + iVar28];
        fVar10 = pfVar58[iVar32 + -1 + iVar27];
        fVar103 = pfVar58[iVar32 + -1 + iVar28];
        fVar11 = pfVar58[iVar29 * iVar36 + -1 + iVar28];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar32 + iVar30] - pfVar58[iVar31 + iVar30]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      auVar83 = vpbroadcastd_avx512vl();
      auVar83 = vpaddd_avx(auVar83,_DAT_005766e0);
      auVar83 = vcvtdq2ps_avx(auVar83);
      auVar24._4_4_ = fVar7;
      auVar24._0_4_ = fVar7;
      auVar24._8_4_ = fVar7;
      auVar24._12_4_ = fVar7;
      auVar23._4_4_ = fVar98;
      auVar23._0_4_ = fVar98;
      auVar23._8_4_ = fVar98;
      auVar23._12_4_ = fVar98;
      auVar85 = vfmadd132ps_fma(auVar83,auVar24,auVar23);
      auVar83 = vshufps_avx(auVar85,auVar85,0xff);
      uVar18 = vcmpps_avx512vl(auVar85,_DAT_00576190,0xd);
      bVar82 = (byte)(uVar18 >> 3);
      iVar28 = (int)((double)((ulong)(bVar82 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar82 & 1) * -0x4020000000000000) +
                    (double)auVar83._0_4_);
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 8);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 8);
      if (((iVar74 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar35 || (iVar29 = iVar1 + iVar28, iimage->width < iVar29)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar28,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar31 = iVar28 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar30 = iimage->data_width;
        iVar60 = iVar30 * iVar37;
        fVar97 = pfVar58[iVar30 * iVar36 + -1 + iVar28];
        iVar32 = iVar30 * (iVar1 + -1 + iVar74);
        fVar118 = pfVar58[iVar32 + -1 + iVar28];
        fVar9 = pfVar58[iVar32 + -1 + iVar29];
        fVar10 = pfVar58[iVar60 + -1 + iVar28];
        fVar103 = pfVar58[iVar60 + -1 + iVar29];
        fVar11 = pfVar58[iVar30 * iVar36 + -1 + iVar29];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar60 + iVar31] - pfVar58[iVar32 + iVar31]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      bVar82 = (byte)uVar18;
      auVar83 = vpermilpd_avx(auVar85,1);
      iVar29 = (int)((double)((ulong)(bVar82 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar82 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar83._0_4_);
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0xc);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0xc);
      if ((((iVar74 < 1) || (iVar29 < 1)) || (iimage->height < iVar35)) ||
         (iVar30 = iVar29 + iVar1, iimage->width < iVar30)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar29,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar60 = iVar29 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar31 = iimage->data_width;
        iVar32 = iVar31 * iVar37;
        fVar97 = pfVar58[iVar31 * iVar36 + -1 + iVar29];
        iVar59 = iVar31 * (iVar1 + -1 + iVar74);
        fVar118 = pfVar58[iVar59 + -1 + iVar29];
        fVar9 = pfVar58[iVar59 + -1 + iVar30];
        fVar10 = pfVar58[iVar32 + -1 + iVar29];
        fVar103 = pfVar58[iVar32 + -1 + iVar30];
        fVar11 = pfVar58[iVar31 * iVar36 + -1 + iVar30];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar32 + iVar60] - pfVar58[iVar59 + iVar60]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      auVar83 = vmovshdup_avx(auVar85);
      iVar30 = (int)((double)((ulong)(bVar82 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar82 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar83._0_4_);
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x10);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x10);
      if (((iVar74 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar35 || (iVar31 = iVar1 + iVar30, iimage->width < iVar31)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar30,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar60 = iVar30 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar32 = iimage->data_width;
        iVar75 = iVar32 * iVar37;
        fVar97 = pfVar58[iVar32 * iVar36 + -1 + iVar30];
        iVar59 = iVar32 * (iVar1 + -1 + iVar74);
        fVar118 = pfVar58[iVar59 + -1 + iVar30];
        fVar9 = pfVar58[iVar59 + -1 + iVar31];
        fVar10 = pfVar58[iVar75 + -1 + iVar30];
        fVar103 = pfVar58[iVar75 + -1 + iVar31];
        fVar11 = pfVar58[iVar32 * iVar36 + -1 + iVar31];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar75 + iVar60] - pfVar58[iVar59 + iVar60]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      local_188 = auVar85._0_4_;
      iVar31 = (int)((double)((ulong)(bVar82 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar82 & 1) * -0x4020000000000000) + (double)local_188);
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x14);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x14);
      if (((iVar74 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar35 || (iVar32 = iVar1 + iVar31, iimage->width < iVar32)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar74,iVar31,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar31 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar37;
        fVar97 = pfVar58[iVar60 * iVar36 + -1 + iVar31];
        iVar79 = iVar60 * (iVar1 + -1 + iVar74);
        fVar118 = pfVar58[iVar79 + -1 + iVar31];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar31];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar36 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x60);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x60);
      if ((((iVar26 < 1) || (iVar53 < 1)) || (iimage->height < iVar38)) ||
         (iVar32 = iVar1 + iVar53, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar26,iVar53,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar59 = iVar53 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar79 = iVar60 * iVar40;
        fVar97 = pfVar58[iVar60 * iVar39 + -1 + iVar53];
        iVar75 = iVar60 * (iVar1 + -1 + iVar26);
        fVar118 = pfVar58[iVar75 + -1 + iVar53];
        fVar9 = pfVar58[iVar75 + -1 + iVar32];
        fVar10 = pfVar58[iVar79 + -1 + iVar53];
        fVar103 = pfVar58[iVar79 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar39 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar79 + iVar59] - pfVar58[iVar75 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 100);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 100);
      if (((iVar26 < 1) || (iVar27 < 1)) ||
         ((iimage->height < iVar38 || (iVar32 = iVar1 + iVar27, iimage->width < iVar32)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar26,iVar27,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar59 = iVar27 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar79 = iVar60 * iVar40;
        fVar97 = pfVar58[iVar60 * iVar39 + -1 + iVar27];
        iVar75 = iVar60 * (iVar1 + -1 + iVar26);
        fVar118 = pfVar58[iVar75 + -1 + iVar27];
        fVar9 = pfVar58[iVar75 + -1 + iVar32];
        fVar10 = pfVar58[iVar79 + -1 + iVar27];
        fVar103 = pfVar58[iVar79 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar39 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar79 + iVar59] - pfVar58[iVar75 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x68);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x68);
      if (((iVar26 < 1) || (iVar28 < 1)) ||
         ((iimage->height < iVar38 || (iVar32 = iVar1 + iVar28, iimage->width < iVar32)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar26,iVar28,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar28 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar40;
        fVar97 = pfVar58[iVar60 * iVar39 + -1 + iVar28];
        iVar79 = iVar60 * (iVar1 + -1 + iVar26);
        fVar118 = pfVar58[iVar79 + -1 + iVar28];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar28];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar39 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x6c);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x6c);
      if ((((iVar26 < 1) || (iVar29 < 1)) || (iimage->height < iVar38)) ||
         (iVar32 = iVar29 + iVar1, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar26,iVar29,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar29 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar40;
        fVar97 = pfVar58[iVar60 * iVar39 + -1 + iVar29];
        iVar79 = iVar60 * (iVar1 + -1 + iVar26);
        fVar118 = pfVar58[iVar79 + -1 + iVar29];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar29];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar39 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x70);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x70);
      if (((iVar26 < 1) || (iVar30 < 1)) ||
         ((iimage->height < iVar38 || (iVar32 = iVar1 + iVar30, iimage->width < iVar32)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar26,iVar30,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar30 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar40;
        fVar97 = pfVar58[iVar60 * iVar39 + -1 + iVar30];
        iVar79 = iVar60 * (iVar1 + -1 + iVar26);
        fVar118 = pfVar58[iVar79 + -1 + iVar30];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar30];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar39 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x74);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x74);
      if (((iVar26 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar38 || (iVar32 = iVar1 + iVar31, iimage->width < iVar32)))) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,iVar26,iVar31,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar31 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar40;
        fVar97 = pfVar58[iVar60 * iVar39 + -1 + iVar31];
        iVar79 = iVar60 * (iVar1 + -1 + iVar26);
        fVar118 = pfVar58[iVar79 + -1 + iVar31];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar31];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar39 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0xc0);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0xc0);
      if (((iVar53 < 1 || uVar81 != 0) || (iimage->height < iVar41)) ||
         (iVar32 = iVar1 + iVar53, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._12_4_,iVar53,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar53 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar43;
        fVar97 = pfVar58[iVar60 * iVar42 + -1 + iVar53];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._12_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar53];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar53];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar42 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0xc4);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0xc4);
      if (((iVar27 < 1 || uVar81 != 0) || (iimage->height < iVar41)) ||
         (iVar32 = iVar1 + iVar27, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._12_4_,iVar27,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar59 = iVar27 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar79 = iVar60 * iVar43;
        fVar97 = pfVar58[iVar60 * iVar42 + -1 + iVar27];
        iVar75 = iVar60 * (iVar1 + -1 + auVar99._12_4_);
        fVar118 = pfVar58[iVar75 + -1 + iVar27];
        fVar9 = pfVar58[iVar75 + -1 + iVar32];
        fVar10 = pfVar58[iVar79 + -1 + iVar27];
        fVar103 = pfVar58[iVar79 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar42 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar79 + iVar59] - pfVar58[iVar75 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 200);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 200);
      if (((iVar28 < 1 || uVar81 != 0) || (iimage->height < iVar41)) ||
         (iVar32 = iVar1 + iVar28, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._12_4_,iVar28,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar28 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar43;
        fVar97 = pfVar58[iVar60 * iVar42 + -1 + iVar28];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._12_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar28];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar28];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar42 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0xcc);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0xcc);
      if (((iVar29 < 1 || uVar81 != 0) || (iimage->height < iVar41)) ||
         (iVar32 = iVar29 + iVar1, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._12_4_,iVar29,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar29 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar43;
        fVar97 = pfVar58[iVar60 * iVar42 + -1 + iVar29];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._12_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar29];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar29];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar42 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0xd0);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0xd0);
      if (((iVar30 < 1 || uVar81 != 0) || (iimage->height < iVar41)) ||
         (iVar32 = iVar1 + iVar30, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._12_4_,iVar30,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar30 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar43;
        fVar97 = pfVar58[iVar60 * iVar42 + -1 + iVar30];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._12_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar30];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar30];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar42 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0xd4);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0xd4);
      if (((iVar31 < 1 || uVar81 != 0) || (iimage->height < iVar41)) ||
         (iVar32 = iVar1 + iVar31, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._12_4_,iVar31,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar31 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar43;
        fVar97 = pfVar58[iVar60 * iVar42 + -1 + iVar31];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._12_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar31];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar31];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar42 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x120);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x120);
      if (((iVar53 < 1 || (uVar54 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar32 = iVar1 + iVar53, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._8_4_,iVar53,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar53 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar46;
        fVar97 = pfVar58[iVar60 * iVar45 + -1 + iVar53];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._8_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar53];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar53];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar45 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x124);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x124);
      if (((iVar27 < 1 || (uVar54 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar32 = iVar1 + iVar27, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._8_4_,iVar27,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar59 = iVar27 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar79 = iVar60 * iVar46;
        fVar97 = pfVar58[iVar60 * iVar45 + -1 + iVar27];
        iVar75 = iVar60 * (iVar1 + -1 + auVar99._8_4_);
        fVar118 = pfVar58[iVar75 + -1 + iVar27];
        fVar9 = pfVar58[iVar75 + -1 + iVar32];
        fVar10 = pfVar58[iVar79 + -1 + iVar27];
        fVar103 = pfVar58[iVar79 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar45 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar79 + iVar59] - pfVar58[iVar75 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x128);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x128);
      if (((iVar28 < 1 || (uVar54 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar32 = iVar1 + iVar28, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._8_4_,iVar28,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar28 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar46;
        fVar97 = pfVar58[iVar60 * iVar45 + -1 + iVar28];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._8_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar28];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar28];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar45 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 300);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 300);
      if (((iVar29 < 1 || (uVar54 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar32 = iVar29 + iVar1, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._8_4_,iVar29,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar29 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar46;
        fVar97 = pfVar58[iVar60 * iVar45 + -1 + iVar29];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._8_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar29];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar29];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar45 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x130);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x130);
      if (((iVar30 < 1 || (uVar54 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar32 = iVar1 + iVar30, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._8_4_,iVar30,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar30 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar46;
        fVar97 = pfVar58[iVar60 * iVar45 + -1 + iVar30];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._8_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar30];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar30];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar45 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x134);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x134);
      if (((iVar31 < 1 || (uVar54 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar32 = iVar1 + iVar31, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._8_4_,iVar31,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar31 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar46;
        fVar97 = pfVar58[iVar60 * iVar45 + -1 + iVar31];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._8_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar31];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar31];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar45 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x180);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x180);
      if (((iVar53 < 1 || (uVar57 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar32 = iVar1 + iVar53, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._4_4_,iVar53,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar53 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar49;
        fVar97 = pfVar58[iVar60 * iVar48 + -1 + iVar53];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._4_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar53];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar53];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar48 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x184);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x184);
      if (((iVar27 < 1 || (uVar57 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar32 = iVar1 + iVar27, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._4_4_,iVar27,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar59 = iVar27 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar79 = iVar60 * iVar49;
        fVar97 = pfVar58[iVar60 * iVar48 + -1 + iVar27];
        iVar75 = iVar60 * (iVar1 + -1 + auVar99._4_4_);
        fVar118 = pfVar58[iVar75 + -1 + iVar27];
        fVar9 = pfVar58[iVar75 + -1 + iVar32];
        fVar10 = pfVar58[iVar79 + -1 + iVar27];
        fVar103 = pfVar58[iVar79 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar48 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar79 + iVar59] - pfVar58[iVar75 + iVar59]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x188);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x188);
      if (((iVar28 < 1 || (uVar57 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar32 = iVar1 + iVar28, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._4_4_,iVar28,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar28 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar49;
        fVar97 = pfVar58[iVar60 * iVar48 + -1 + iVar28];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._4_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar28];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar28];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar48 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x18c);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x18c);
      if (((iVar29 < 1 || (uVar57 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar32 = iVar29 + iVar1, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._4_4_,iVar29,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar29 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar49;
        fVar97 = pfVar58[iVar60 * iVar48 + -1 + iVar29];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._4_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar29];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar29];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar48 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 400);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 400);
      if (((iVar30 < 1 || (uVar57 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar32 = iVar1 + iVar30, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._4_4_,iVar30,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar30 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar49;
        fVar97 = pfVar58[iVar60 * iVar48 + -1 + iVar30];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._4_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar30];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar30];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar48 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x194);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x194);
      if (((iVar31 < 1 || (uVar57 & 1) != 0) || (iimage->height < iVar47)) ||
         (iVar32 = iVar1 + iVar31, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._4_4_,iVar31,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar31 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar59 = iVar60 * iVar49;
        fVar97 = pfVar58[iVar60 * iVar48 + -1 + iVar31];
        iVar79 = iVar60 * (iVar1 + -1 + auVar99._4_4_);
        fVar118 = pfVar58[iVar79 + -1 + iVar31];
        fVar9 = pfVar58[iVar79 + -1 + iVar32];
        fVar10 = pfVar58[iVar59 + -1 + iVar31];
        fVar103 = pfVar58[iVar59 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar48 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar79 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x1e0);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x1e0);
      if (((iVar53 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar32 = iVar1 + iVar53, iimage->width < iVar32)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._0_4_,iVar53,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar79 = iVar53 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar60 = iimage->data_width;
        iVar75 = iVar60 * iVar52;
        fVar97 = pfVar58[iVar60 * iVar51 + -1 + iVar53];
        iVar59 = iVar60 * (iVar1 + -1 + auVar99._0_4_);
        fVar118 = pfVar58[iVar59 + -1 + iVar53];
        fVar9 = pfVar58[iVar59 + -1 + iVar32];
        fVar10 = pfVar58[iVar75 + -1 + iVar53];
        fVar103 = pfVar58[iVar75 + -1 + iVar32];
        fVar11 = pfVar58[iVar60 * iVar51 + -1 + iVar32];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar75 + iVar79] - pfVar58[iVar59 + iVar79]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x1e4);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x1e4);
      if (((iVar27 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar53 = iVar1 + iVar27, iimage->width < iVar53)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._0_4_,iVar27,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar75 = iVar27 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar32 = iimage->data_width;
        iVar59 = iVar32 * iVar52;
        fVar97 = pfVar58[iVar32 * iVar51 + -1 + iVar27];
        iVar60 = iVar32 * (iVar1 + -1 + auVar99._0_4_);
        fVar118 = pfVar58[iVar60 + -1 + iVar27];
        fVar9 = pfVar58[iVar60 + -1 + iVar53];
        fVar10 = pfVar58[iVar59 + -1 + iVar27];
        fVar103 = pfVar58[iVar59 + -1 + iVar53];
        fVar11 = pfVar58[iVar32 * iVar51 + -1 + iVar53];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar75] - pfVar58[iVar60 + iVar75]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x1e8);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x1e8);
      if (((iVar28 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar53 = iVar1 + iVar28, iimage->width < iVar53)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._0_4_,iVar28,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar32 = iVar28 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar27 = iimage->data_width;
        iVar59 = iVar27 * iVar52;
        fVar97 = pfVar58[iVar27 * iVar51 + -1 + iVar28];
        iVar60 = iVar27 * (iVar1 + -1 + auVar99._0_4_);
        fVar118 = pfVar58[iVar60 + -1 + iVar28];
        fVar9 = pfVar58[iVar60 + -1 + iVar53];
        fVar10 = pfVar58[iVar59 + -1 + iVar28];
        fVar103 = pfVar58[iVar59 + -1 + iVar53];
        fVar11 = pfVar58[iVar27 * iVar51 + -1 + iVar53];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar59 + iVar32] - pfVar58[iVar60 + iVar32]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x1ec);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x1ec);
      if (((iVar29 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar53 = iVar29 + iVar1, iimage->width < iVar53)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._0_4_,iVar29,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar28 = iVar29 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar27 = iimage->data_width;
        iVar60 = iVar27 * iVar52;
        fVar97 = pfVar58[iVar27 * iVar51 + -1 + iVar29];
        iVar32 = iVar27 * (iVar1 + -1 + auVar99._0_4_);
        fVar118 = pfVar58[iVar32 + -1 + iVar29];
        fVar9 = pfVar58[iVar32 + -1 + iVar53];
        fVar10 = pfVar58[iVar60 + -1 + iVar29];
        fVar103 = pfVar58[iVar60 + -1 + iVar53];
        fVar11 = pfVar58[iVar27 * iVar51 + -1 + iVar53];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar60 + iVar28] - pfVar58[iVar32 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 0x1f0);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 0x1f0);
      if (((iVar30 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar53 = iVar1 + iVar30, iimage->width < iVar53)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._0_4_,iVar30,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar28 = iVar30 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar27 = iimage->data_width;
        iVar32 = iVar27 * iVar52;
        fVar97 = pfVar58[iVar27 * iVar51 + -1 + iVar30];
        iVar29 = iVar27 * (iVar1 + -1 + auVar99._0_4_);
        fVar118 = pfVar58[iVar29 + -1 + iVar30];
        fVar9 = pfVar58[iVar29 + -1 + iVar53];
        fVar10 = pfVar58[iVar32 + -1 + iVar30];
        fVar103 = pfVar58[iVar32 + -1 + iVar53];
        fVar11 = pfVar58[iVar27 * iVar51 + -1 + iVar53];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar32 + iVar28] - pfVar58[iVar29 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      pfVar63 = (float *)((long)haarResponseX + lVar71 + 500);
      pfVar64 = (float *)((long)haarResponseY + lVar71 + 500);
      if (((iVar31 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar50)) ||
         (iVar53 = iVar1 + iVar31, iimage->width < iVar53)) {
        auVar121 = ZEXT1664(auVar121._0_16_);
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        haarXY(iimage,auVar99._0_4_,iVar31,iVar78,pfVar63,pfVar64);
      }
      else {
        iVar28 = iVar31 + -1 + iVar78;
        pfVar58 = iimage->data;
        iVar27 = iimage->data_width;
        iVar30 = iVar27 * iVar52;
        fVar97 = pfVar58[iVar27 * iVar51 + -1 + iVar31];
        iVar29 = iVar27 * (iVar1 + -1 + auVar99._0_4_);
        fVar118 = pfVar58[iVar29 + -1 + iVar31];
        fVar9 = pfVar58[iVar29 + -1 + iVar53];
        fVar10 = pfVar58[iVar30 + -1 + iVar31];
        fVar103 = pfVar58[iVar30 + -1 + iVar53];
        fVar11 = pfVar58[iVar27 * iVar51 + -1 + iVar53];
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(pfVar58[iVar30 + iVar28] - pfVar58[iVar29 + iVar28]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar63 = (fVar118 - fVar103) + auVar83._0_4_;
        auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar97 - fVar11)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar9 - fVar10)));
        *pfVar64 = auVar83._0_4_ - (fVar118 - fVar103);
      }
      auVar125 = ZEXT1664(auVar84);
      lVar71 = lVar71 + 0x18;
      bVar2 = iVar55 < 6;
      iVar55 = iVar55 + 6;
    } while (bVar2);
    lVar72 = lVar72 + 0x240;
    bVar2 = (int)uVar33 < 6;
    uVar33 = uVar33 + 6;
  } while (bVar2);
LAB_002762e3:
  fVar98 = auVar125._0_4_;
  auVar124._8_4_ = 0x3effffff;
  auVar124._0_8_ = 0x3effffff3effffff;
  auVar124._12_4_ = 0x3effffff;
  auVar123._8_4_ = 0x80000000;
  auVar123._0_8_ = 0x8000000080000000;
  auVar123._12_4_ = 0x80000000;
  auVar83 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 0.5)),auVar123,0xf8);
  auVar83 = ZEXT416((uint)(fVar98 * 0.5 + auVar83._0_4_));
  auVar83 = vroundss_avx(auVar83,auVar83,0xb);
  auVar84 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 1.5)),auVar123,0xf8);
  auVar84 = ZEXT416((uint)(fVar98 * 1.5 + auVar84._0_4_));
  auVar84 = vroundss_avx(auVar84,auVar84,0xb);
  auVar85 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 2.5)),auVar123,0xf8);
  auVar85 = ZEXT416((uint)(fVar98 * 2.5 + auVar85._0_4_));
  auVar85 = vroundss_avx(auVar85,auVar85,0xb);
  auVar86 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 3.5)),auVar123,0xf8);
  auVar86 = ZEXT416((uint)(fVar98 * 3.5 + auVar86._0_4_));
  auVar86 = vroundss_avx(auVar86,auVar86,0xb);
  auVar87 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 4.5)),auVar123,0xf8);
  auVar87 = ZEXT416((uint)(fVar98 * 4.5 + auVar87._0_4_));
  auVar87 = vroundss_avx(auVar87,auVar87,0xb);
  auVar88 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 5.5)),auVar123,0xf8);
  auVar88 = ZEXT416((uint)(fVar98 * 5.5 + auVar88._0_4_));
  auVar88 = vroundss_avx(auVar88,auVar88,0xb);
  auVar89 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 6.5)),auVar123,0xf8);
  auVar89 = ZEXT416((uint)(fVar98 * 6.5 + auVar89._0_4_));
  auVar89 = vroundss_avx(auVar89,auVar89,0xb);
  auVar90 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 7.5)),auVar123,0xf8);
  auVar90 = ZEXT416((uint)(auVar90._0_4_ + fVar98 * 7.5));
  auVar90 = vroundss_avx(auVar90,auVar90,0xb);
  auVar91 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 8.5)),auVar123,0xf8);
  auVar91 = ZEXT416((uint)(fVar98 * 8.5 + auVar91._0_4_));
  auVar91 = vroundss_avx(auVar91,auVar91,0xb);
  auVar92 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 9.5)),auVar123,0xf8);
  auVar92 = ZEXT416((uint)(fVar98 * 9.5 + auVar92._0_4_));
  auVar92 = vroundss_avx(auVar92,auVar92,0xb);
  auVar93 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 10.5)),auVar123,0xf8);
  auVar93 = ZEXT416((uint)(fVar98 * 10.5 + auVar93._0_4_));
  auVar93 = vroundss_avx(auVar93,auVar93,0xb);
  auVar94 = vpternlogd_avx512vl(auVar124,ZEXT416((uint)(fVar98 * 11.5)),auVar123,0xf8);
  auVar94 = ZEXT416((uint)(fVar98 * 11.5 + auVar94._0_4_));
  auVar94 = vroundss_avx(auVar94,auVar94,0xb);
  fVar103 = auVar85._0_4_;
  fVar98 = fVar103 + auVar84._0_4_;
  fVar7 = fVar103 + auVar83._0_4_;
  fVar8 = fVar103 - auVar83._0_4_;
  fVar97 = fVar103 - auVar84._0_4_;
  fVar118 = fVar103 - auVar86._0_4_;
  fVar9 = fVar103 - auVar87._0_4_;
  fVar10 = fVar103 - auVar88._0_4_;
  fVar103 = fVar103 - auVar89._0_4_;
  fVar120 = auVar90._0_4_;
  fVar11 = fVar120 - auVar86._0_4_;
  fVar12 = fVar120 - auVar87._0_4_;
  fVar13 = fVar120 - auVar88._0_4_;
  fVar14 = fVar120 - auVar89._0_4_;
  fVar15 = fVar120 - auVar91._0_4_;
  fVar16 = fVar120 - auVar92._0_4_;
  fVar17 = fVar120 - auVar93._0_4_;
  fVar120 = fVar120 - auVar94._0_4_;
  gauss_s1_c0[0] = expf(fVar98 * fVar98 * fVar96);
  gauss_s1_c0[1] = expf(fVar7 * fVar7 * fVar96);
  gauss_s1_c0[2] = expf(fVar8 * fVar8 * fVar96);
  gauss_s1_c0[3] = expf(fVar97 * fVar97 * fVar96);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar118 * fVar118 * fVar96);
  gauss_s1_c0[6] = expf(fVar9 * fVar9 * fVar96);
  gauss_s1_c0[7] = expf(fVar10 * fVar10 * fVar96);
  gauss_s1_c0[8] = expf(fVar103 * fVar103 * fVar96);
  gauss_s1_c1[0] = expf(fVar11 * fVar11 * fVar96);
  gauss_s1_c1[1] = expf(fVar12 * fVar12 * fVar96);
  gauss_s1_c1[2] = expf(fVar13 * fVar13 * fVar96);
  gauss_s1_c1[3] = expf(fVar14 * fVar14 * fVar96);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar15 * fVar15 * fVar96);
  gauss_s1_c1[6] = expf(fVar16 * fVar16 * fVar96);
  gauss_s1_c1[7] = expf(fVar17 * fVar17 * fVar96);
  gauss_s1_c1[8] = expf(fVar120 * fVar120 * fVar96);
  uVar34 = 0xfffffff8;
  lVar72 = 0;
  fVar98 = 0.0;
  auVar102._8_4_ = 0x7fffffff;
  auVar102._0_8_ = 0x7fffffff7fffffff;
  auVar102._12_4_ = 0x7fffffff;
  lVar71 = 0;
  lVar65 = 0;
  do {
    pfVar63 = gauss_s1_c1;
    uVar33 = (uint)uVar34;
    if (uVar33 != 7) {
      pfVar63 = gauss_s1_c0;
    }
    if (uVar33 == 0xfffffff8) {
      pfVar63 = gauss_s1_c1;
    }
    lVar71 = (long)(int)lVar71;
    iVar78 = (int)lVar65;
    lVar65 = (long)iVar78;
    lVar62 = (long)haarResponseX + lVar72;
    lVar56 = (long)haarResponseY + lVar72;
    uVar61 = 0xfffffff8;
    uVar57 = 0;
    do {
      pfVar64 = gauss_s1_c1;
      if (uVar61 != 7) {
        pfVar64 = gauss_s1_c0;
      }
      if (uVar61 == 0xfffffff8) {
        pfVar64 = gauss_s1_c1;
      }
      uVar81 = (ulong)(uVar61 >> 0x1c & 0xfffffff8);
      auVar121 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar54 = uVar57;
      lVar73 = lVar62;
      lVar77 = lVar56;
      do {
        lVar66 = 0;
        pfVar58 = (float *)((long)pfVar63 + (ulong)(uint)((int)(uVar34 >> 0x1f) << 5));
        do {
          fVar7 = pfVar64[uVar81] * *pfVar58;
          auVar83 = vinsertps_avx(ZEXT416(*(uint *)(lVar77 + lVar66 * 4)),
                                  ZEXT416(*(uint *)(lVar73 + lVar66 * 4)),0x10);
          auVar117._0_4_ = fVar7 * auVar83._0_4_;
          auVar117._4_4_ = fVar7 * auVar83._4_4_;
          auVar117._8_4_ = fVar7 * auVar83._8_4_;
          auVar117._12_4_ = fVar7 * auVar83._12_4_;
          auVar83 = vandps_avx(auVar117,auVar102);
          auVar83 = vmovlhps_avx(auVar117,auVar83);
          auVar105._0_4_ = auVar121._0_4_ + auVar83._0_4_;
          auVar105._4_4_ = auVar121._4_4_ + auVar83._4_4_;
          auVar105._8_4_ = auVar121._8_4_ + auVar83._8_4_;
          auVar105._12_4_ = auVar121._12_4_ + auVar83._12_4_;
          auVar121 = ZEXT1664(auVar105);
          pfVar58 = pfVar58 + (ulong)(~uVar33 >> 0x1f) * 2 + -1;
          lVar66 = lVar66 + 1;
        } while (lVar66 != 9);
        uVar54 = uVar54 + 0x18;
        uVar81 = uVar81 + (ulong)(-1 < (int)uVar61) * 2 + -1;
        lVar73 = lVar73 + 0x60;
        lVar77 = lVar77 + 0x60;
      } while (uVar54 < uVar61 * 0x18 + 0x198);
      fVar7 = gauss_s2_arr[lVar65];
      auVar21._4_4_ = fVar7;
      auVar21._0_4_ = fVar7;
      auVar21._8_4_ = fVar7;
      auVar21._12_4_ = fVar7;
      auVar85 = vmulps_avx512vl(auVar105,auVar21);
      lVar65 = lVar65 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar71) = auVar85;
      auVar107._0_4_ = auVar85._0_4_ * auVar85._0_4_;
      auVar107._4_4_ = auVar85._4_4_ * auVar85._4_4_;
      auVar107._8_4_ = auVar85._8_4_ * auVar85._8_4_;
      auVar107._12_4_ = auVar85._12_4_ * auVar85._12_4_;
      auVar83 = vmovshdup_avx(auVar107);
      auVar84 = vfmadd231ss_fma(auVar83,auVar85,auVar85);
      auVar83 = vshufpd_avx(auVar85,auVar85,1);
      auVar84 = vfmadd213ss_fma(auVar83,auVar83,auVar84);
      auVar83 = vshufps_avx(auVar85,auVar85,0xff);
      auVar83 = vfmadd213ss_fma(auVar83,auVar83,auVar84);
      fVar98 = fVar98 + auVar83._0_4_;
      lVar71 = lVar71 + 4;
      uVar61 = uVar61 + 5;
      uVar57 = uVar57 + 0x78;
      lVar62 = lVar62 + 0x1e0;
      lVar56 = lVar56 + 0x1e0;
    } while (iVar78 + 4 != (int)lVar65);
    lVar72 = lVar72 + 0x14;
    uVar34 = (ulong)(uVar33 + 5);
  } while ((int)uVar33 < 3);
  if (fVar98 < 0.0) {
    fVar98 = sqrtf(fVar98);
  }
  else {
    auVar83 = vsqrtss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98));
    fVar98 = auVar83._0_4_;
  }
  auVar121 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar98)));
  lVar72 = 0;
  do {
    auVar125 = vmulps_avx512f(auVar121,*(undefined1 (*) [64])(ipoint->descriptor + lVar72));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar72) = auVar125;
    lVar72 = lVar72 + 0x10;
  } while (lVar72 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_6_6_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            float ipoint_y_sub_int_scale_add_l4_mul_scale = ipoint_y_sub_int_scale + l4 * scale;
            float ipoint_y_sub_int_scale_add_l5_mul_scale = ipoint_y_sub_int_scale + l5 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_l4_mul_scale + (ipoint_y_sub_int_scale_add_l4_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_l5_mul_scale + (ipoint_y_sub_int_scale_add_l5_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count4*24+k_count3], &haarResponseY[l_count4*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count4*24+k_count4], &haarResponseY[l_count4*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count4*24+k_count5], &haarResponseY[l_count4*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count5*24+k_count3], &haarResponseY[l_count5*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count5*24+k_count4], &haarResponseY[l_count5*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count5*24+k_count5], &haarResponseY[l_count5*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=6, l_count+=6) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l4 = l + 4;
            int l5 = l + 5;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int l_count4 = l_count + 4;
            int l_count5 = l_count + 5;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);
            int sample_y_sub_int_scale4 = (int) (ipoint_y_sub_int_scale_add_05 + l4 * scale);
            int sample_y_sub_int_scale5 = (int) (ipoint_y_sub_int_scale_add_05 + l5 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count4*24+k_count0], &haarResponseY[l_count4*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count4*24+k_count1], &haarResponseY[l_count4*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count4*24+k_count2], &haarResponseY[l_count4*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count4*24+k_count3], &haarResponseY[l_count4*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count4*24+k_count4], &haarResponseY[l_count4*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale4, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count4*24+k_count5], &haarResponseY[l_count4*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count5*24+k_count0], &haarResponseY[l_count5*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count5*24+k_count1], &haarResponseY[l_count5*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count5*24+k_count2], &haarResponseY[l_count5*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count5*24+k_count3], &haarResponseY[l_count5*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count5*24+k_count4], &haarResponseY[l_count5*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale5, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count5*24+k_count5], &haarResponseY[l_count5*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}